

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_SetNativeIntElementI_UInt32
               (Var instance,uint32 aElementIndex,int32 iValue,ScriptContext *scriptContext,
               PropertyOperationFlags flags)

{
  BOOL BVar1;
  Var aElementIndex_00;
  PropertyOperationFlags flags_local;
  ScriptContext *scriptContext_local;
  int32 iValue_local;
  uint32 aElementIndex_local;
  Var instance_local;
  
  aElementIndex_00 = JavascriptNumber::ToVar(aElementIndex,scriptContext);
  BVar1 = OP_SetNativeIntElementI(instance,aElementIndex_00,iValue,scriptContext,flags);
  return BVar1;
}

Assistant:

BOOL JavascriptOperators::OP_SetNativeIntElementI_UInt32(
        Var instance,
        uint32 aElementIndex,
        int32 iValue,
        ScriptContext* scriptContext,
        PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetNativeIntElementI_UInt32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_SetNativeIntElementI_UInt32, Op_SetNativeIntElementI);
#if FLOATVAR
        return OP_SetNativeIntElementI(instance, Js::JavascriptNumber::ToVar(aElementIndex, scriptContext), iValue, scriptContext, flags);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_SetNativeIntElementI(instance, Js::JavascriptNumber::ToVarInPlace(aElementIndex, scriptContext,
            (Js::JavascriptNumber *)buffer), iValue, scriptContext, flags);
#endif
        JIT_HELPER_END(Op_SetNativeIntElementI_UInt32);
    }